

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

void __thiscall mkvparser::Tags::~Tags(Tags *this)

{
  int iVar1;
  
  iVar1 = this->m_tags_count;
  while (0 < iVar1) {
    this->m_tags_count = iVar1 - 1U;
    Tag::Clear(this->m_tags + (iVar1 - 1U));
    iVar1 = this->m_tags_count;
  }
  if (this->m_tags != (Tag *)0x0) {
    operator_delete__(&this->m_tags[-1].m_simple_tags_size);
    return;
  }
  return;
}

Assistant:

Tags::~Tags() {
  while (m_tags_count > 0) {
    Tag& t = m_tags[--m_tags_count];
    t.Clear();
  }
  delete[] m_tags;
}